

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O0

int decode_hex4(char *buf,uint32_t *result)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uStack_24;
  char c;
  uint32_t x;
  uint32_t u;
  uint32_t *result_local;
  char *buf_local;
  
  bVar1 = *buf;
  if (((char)bVar1 < '0') || ('9' < (char)bVar1)) {
    bVar1 = bVar1 | 0x20;
    if (((char)bVar1 < 'a') || ('f' < (char)bVar1)) {
      return -1;
    }
    iVar2 = (char)bVar1 + -0x57;
  }
  else {
    iVar2 = (char)bVar1 + -0x30;
  }
  uStack_24 = iVar2 * 0x1000;
  bVar1 = buf[1];
  if (((char)bVar1 < '0') || ('9' < (char)bVar1)) {
    bVar1 = bVar1 | 0x20;
    if (((char)bVar1 < 'a') || ('f' < (char)bVar1)) {
      return -1;
    }
    iVar2 = (char)bVar1 + -0x57;
  }
  else {
    iVar2 = (char)bVar1 + -0x30;
  }
  uStack_24 = iVar2 * 0x100 | uStack_24;
  bVar1 = buf[2];
  if (((char)bVar1 < '0') || ('9' < (char)bVar1)) {
    bVar1 = bVar1 | 0x20;
    if (((char)bVar1 < 'a') || ('f' < (char)bVar1)) {
      return -1;
    }
    iVar2 = (char)bVar1 + -0x57;
  }
  else {
    iVar2 = (char)bVar1 + -0x30;
  }
  uStack_24 = iVar2 * 0x10 | uStack_24;
  bVar1 = buf[3];
  if (((char)bVar1 < '0') || ('9' < (char)bVar1)) {
    bVar1 = bVar1 | 0x20;
    if (((char)bVar1 < 'a') || ('f' < (char)bVar1)) {
      return -1;
    }
    uVar3 = (int)(char)bVar1 - 0x57;
  }
  else {
    uVar3 = (int)(char)bVar1 - 0x30;
  }
  uStack_24 = uVar3 | uStack_24;
  *result = uStack_24;
  return 0;
}

Assistant:

static int decode_hex4(const char *buf, uint32_t *result)
{
    uint32_t u, x;
    char c;

    u = 0;
    c = buf[0];
    if (c >= '0' && c <= '9') {
        x = (uint32_t)(c - '0');
        u = x << 12;
    } else {
        /* Lower case. */
        c |= 0x20;
        if (c >= 'a' && c <= 'f') {
            x = (uint32_t)(c - 'a' + 10);
            u |= x << 12;
        } else {
            return -1;
        }
    }
    c = buf[1];
    if (c >= '0' && c <= '9') {
        x = (uint32_t)(c - '0');
        u |= x << 8;
    } else {
        /* Lower case. */
        c |= 0x20;
        if (c >= 'a' && c <= 'f') {
            x = (uint32_t)(c - 'a' + 10);
            u |= x << 8;
        } else {
            return -1;
        }
    }
    c = buf[2];
    if (c >= '0' && c <= '9') {
        x = (uint32_t)(c - '0');
        u |= x << 4;
    } else {
        /* Lower case. */
        c |= 0x20;
        if (c >= 'a' && c <= 'f') {
            x = (uint32_t)(c - 'a' + 10);
            u |= x << 4;
        } else {
            return -1;
        }
    }
    c = buf[3];
    if (c >= '0' && c <= '9') {
        x = (uint32_t)(c - '0');
        u |= x;
    } else {
        /* Lower case. */
        c |= 0x20;
        if (c >= 'a' && c <= 'f') {
            x = (uint32_t)(c - 'a' + 10);
            u |= x;
        } else {
            return -1;
        }
    }
    *result = u;
    return 0;
}